

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  ForwardTypedefDeclarationSyntax *pFVar1;
  DeepCloneVisitor visitor;
  Token local_60;
  Token local_50;
  ForwardTypeRestrictionSyntax *local_40;
  Token local_38;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x60) == (SyntaxNode *)0x0) {
    local_40 = (ForwardTypeRestrictionSyntax *)0x0;
  }
  else {
    local_40 = (ForwardTypeRestrictionSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x60),(DeepCloneVisitor *)&local_50,
                          (BumpAllocator *)__child_stack);
  }
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::ForwardTypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ForwardTypeRestrictionSyntax*,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_60,&local_40,&local_50,&local_38);
  return (int)pFVar1;
}

Assistant:

static SyntaxNode* clone(const ForwardTypedefDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ForwardTypedefDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.typedefKeyword.deepClone(alloc),
        node.typeRestriction ? deepClone(*node.typeRestriction, alloc) : nullptr,
        node.name.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}